

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O2

void logger_worker(WorkerArgs *args)

{
  SimpleLogger *this;
  Timer *this_00;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  size_t sStackY_40;
  
  this = args->ll;
  this_00 = args->tt;
  do {
    iVar2 = get_random_level();
    switch(iVar2) {
    case 1:
      if ((this != (SimpleLogger *)0x0) && (0 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        uVar3 = TestSuite::Timer::getTimeUs(this_00);
        iVar2 = 1;
        sStackY_40 = 0x3a;
LAB_00104cf7:
        SimpleLogger::put(this,iVar2,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                          ,"logger_worker",sStackY_40,"%ld",uVar3);
      }
      break;
    case 2:
      if ((this != (SimpleLogger *)0x0) && (1 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        uVar3 = TestSuite::Timer::getTimeUs(this_00);
        iVar2 = 2;
        sStackY_40 = 0x3c;
        goto LAB_00104cf7;
      }
      break;
    case 3:
      if ((this != (SimpleLogger *)0x0) && (2 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        uVar3 = TestSuite::Timer::getTimeUs(this_00);
        iVar2 = 3;
        sStackY_40 = 0x3e;
        goto LAB_00104cf7;
      }
      break;
    case 4:
      if ((this != (SimpleLogger *)0x0) && (3 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        uVar3 = TestSuite::Timer::getTimeUs(this_00);
        iVar2 = 4;
        sStackY_40 = 0x40;
        goto LAB_00104cf7;
      }
      break;
    default:
      if ((this != (SimpleLogger *)0x0) && (4 < (this->curLogLevel).super___atomic_base<int>._M_i))
      {
        uVar3 = TestSuite::Timer::getTimeUs(this_00);
        iVar2 = 5;
        sStackY_40 = 0x42;
        goto LAB_00104cf7;
      }
    }
    bVar1 = TestSuite::Timer::timeover(this_00);
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void logger_worker(WorkerArgs* args) {
    SimpleLogger* ll = args->ll;
    TestSuite::Timer& tt = *args->tt;
    do {
        int level = get_random_level();
        if (level == 1) {
            _log_fatal(ll, "%ld", tt.getTimeUs());
        } else if (level == 2) {
            _log_err(ll, "%ld", tt.getTimeUs());
        } else if (level == 3) {
            _log_warn(ll, "%ld", tt.getTimeUs());
        } else if (level == 4) {
            _log_info(ll, "%ld", tt.getTimeUs());
        } else if (level == 5) {
            _log_debug(ll, "%ld", tt.getTimeUs());
        }
    } while(!tt.timeover());
}